

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O0

void __thiscall VulkanHppGenerator::distributeEnumValueAliases(VulkanHppGenerator *this)

{
  int iVar1;
  bool bVar2;
  __type_conflict condition;
  reference ppVar3;
  vector<VulkanHppGenerator::EnumValueAlias,_std::allocator<VulkanHppGenerator::EnumValueAlias>_>
  *this_00;
  pointer name;
  string *__lhs;
  pointer pEVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  EnumValueData *local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  __normal_iterator<VulkanHppGenerator::EnumValueData_*,_std::vector<VulkanHppGenerator::EnumValueData,_std::allocator<VulkanHppGenerator::EnumValueData>_>_>
  local_110;
  EnumValueData *local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  __normal_iterator<VulkanHppGenerator::EnumValueAlias_*,_std::vector<VulkanHppGenerator::EnumValueAlias,_std::allocator<VulkanHppGenerator::EnumValueAlias>_>_>
  local_70;
  __normal_iterator<VulkanHppGenerator::EnumValueAlias_*,_std::vector<VulkanHppGenerator::EnumValueAlias,_std::allocator<VulkanHppGenerator::EnumValueAlias>_>_>
  local_68;
  iterator aliasIt;
  __normal_iterator<VulkanHppGenerator::EnumValueData_*,_std::vector<VulkanHppGenerator::EnumValueData,_std::allocator<VulkanHppGenerator::EnumValueData>_>_>
  local_58;
  iterator valueIt;
  EnumValueAlias *a;
  iterator __end2;
  iterator __begin2;
  vector<VulkanHppGenerator::EnumValueAlias,_std::allocator<VulkanHppGenerator::EnumValueAlias>_>
  *__range2;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>
  *e;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>_>_>
  *__range1;
  VulkanHppGenerator *this_local;
  
  bVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<VulkanHppGenerator::EnumExtendData,_std::allocator<VulkanHppGenerator::EnumExtendData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<VulkanHppGenerator::EnumExtendData,_std::allocator<VulkanHppGenerator::EnumExtendData>_>_>_>_>
          ::empty(&this->m_enumExtends);
  if (bVar2) {
    __end1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>_>_>
             ::begin(&this->m_enums);
    e = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>
         *)std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>_>_>
           ::end(&this->m_enums);
    while (bVar2 = std::operator==(&__end1,(_Self *)&e), ((bVar2 ^ 0xffU) & 1) != 0) {
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>_>
               ::operator*(&__end1);
      this_00 = &(ppVar3->second).valueAliases;
      __end2 = std::
               vector<VulkanHppGenerator::EnumValueAlias,_std::allocator<VulkanHppGenerator::EnumValueAlias>_>
               ::begin(this_00);
      a = (EnumValueAlias *)
          std::
          vector<VulkanHppGenerator::EnumValueAlias,_std::allocator<VulkanHppGenerator::EnumValueAlias>_>
          ::end(this_00);
      while (bVar2 = __gnu_cxx::
                     operator==<VulkanHppGenerator::EnumValueAlias_*,_std::vector<VulkanHppGenerator::EnumValueAlias,_std::allocator<VulkanHppGenerator::EnumValueAlias>_>_>
                               (&__end2,(__normal_iterator<VulkanHppGenerator::EnumValueAlias_*,_std::vector<VulkanHppGenerator::EnumValueAlias,_std::allocator<VulkanHppGenerator::EnumValueAlias>_>_>
                                         *)&a), ((bVar2 ^ 0xffU) & 1) != 0) {
        valueIt._M_current =
             (EnumValueData *)
             __gnu_cxx::
             __normal_iterator<VulkanHppGenerator::EnumValueAlias_*,_std::vector<VulkanHppGenerator::EnumValueAlias,_std::allocator<VulkanHppGenerator::EnumValueAlias>_>_>
             ::operator*(&__end2);
        local_58._M_current =
             (EnumValueData *)
             anon_unknown.dwarf_b1723::findByName<VulkanHppGenerator::EnumValueData>
                       (&(ppVar3->second).values,(string *)valueIt._M_current);
        aliasIt._M_current =
             (EnumValueAlias *)
             std::
             vector<VulkanHppGenerator::EnumValueData,_std::allocator<VulkanHppGenerator::EnumValueData>_>
             ::end(&(ppVar3->second).values);
        bVar2 = __gnu_cxx::
                operator==<VulkanHppGenerator::EnumValueData_*,_std::vector<VulkanHppGenerator::EnumValueData,_std::allocator<VulkanHppGenerator::EnumValueData>_>_>
                          (&local_58,
                           (__normal_iterator<VulkanHppGenerator::EnumValueData_*,_std::vector<VulkanHppGenerator::EnumValueData,_std::allocator<VulkanHppGenerator::EnumValueData>_>_>
                            *)&aliasIt);
        if (bVar2) {
          local_68._M_current =
               (EnumValueAlias *)
               anon_unknown.dwarf_b1723::findByName<VulkanHppGenerator::EnumValueAlias>
                         (&(ppVar3->second).valueAliases,(string *)valueIt._M_current);
          local_70._M_current =
               (EnumValueAlias *)
               std::
               vector<VulkanHppGenerator::EnumValueAlias,_std::allocator<VulkanHppGenerator::EnumValueAlias>_>
               ::end(&(ppVar3->second).valueAliases);
          bVar2 = __gnu_cxx::
                  operator==<VulkanHppGenerator::EnumValueAlias_*,_std::vector<VulkanHppGenerator::EnumValueAlias,_std::allocator<VulkanHppGenerator::EnumValueAlias>_>_>
                            (&local_68,&local_70);
          iVar1 = *(int *)((long)&((valueIt._M_current)->protect)._M_dataplus._M_p + 4);
          std::operator+(&local_f0,"enum value alias <",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &((valueIt._M_current)->bitpos)._M_string_length);
          std::operator+(&local_d0,&local_f0,"> aliases non-existent enum value <");
          std::operator+(&local_b0,&local_d0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         valueIt._M_current);
          std::operator+(&local_90,&local_b0,">");
          checkForError(!bVar2,iVar1,&local_90);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)&local_b0);
          std::__cxx11::string::~string((string *)&local_d0);
          std::__cxx11::string::~string((string *)&local_f0);
          name = __gnu_cxx::
                 __normal_iterator<VulkanHppGenerator::EnumValueAlias_*,_std::vector<VulkanHppGenerator::EnumValueAlias,_std::allocator<VulkanHppGenerator::EnumValueAlias>_>_>
                 ::operator->(&local_68);
          local_108 = (EnumValueData *)
                      anon_unknown.dwarf_b1723::findByName<VulkanHppGenerator::EnumValueData>
                                (&(ppVar3->second).values,&name->alias);
          local_58._M_current = local_108;
        }
        local_110._M_current =
             (EnumValueData *)
             std::
             vector<VulkanHppGenerator::EnumValueData,_std::allocator<VulkanHppGenerator::EnumValueData>_>
             ::end(&(ppVar3->second).values);
        bVar2 = __gnu_cxx::
                operator==<VulkanHppGenerator::EnumValueData_*,_std::vector<VulkanHppGenerator::EnumValueData,_std::allocator<VulkanHppGenerator::EnumValueData>_>_>
                          (&local_58,&local_110);
        iVar1 = *(int *)((long)&((valueIt._M_current)->protect)._M_dataplus._M_p + 4);
        std::operator+(&local_190,"enum value alias <",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &((valueIt._M_current)->bitpos)._M_string_length);
        std::operator+(&local_170,&local_190,"> aliases non-existent enum value <");
        std::operator+(&local_150,&local_170,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       valueIt._M_current);
        std::operator+(&local_130,&local_150,">");
        checkForError(!bVar2,iVar1,&local_130);
        std::__cxx11::string::~string((string *)&local_130);
        std::__cxx11::string::~string((string *)&local_150);
        std::__cxx11::string::~string((string *)&local_170);
        std::__cxx11::string::~string((string *)&local_190);
        __lhs = &(valueIt._M_current)->name;
        pEVar4 = __gnu_cxx::
                 __normal_iterator<VulkanHppGenerator::EnumValueData_*,_std::vector<VulkanHppGenerator::EnumValueData,_std::allocator<VulkanHppGenerator::EnumValueData>_>_>
                 ::operator->(&local_58);
        condition = std::operator==(__lhs,&pEVar4->protect);
        iVar1 = *(int *)((long)&((valueIt._M_current)->protect)._M_dataplus._M_p + 4);
        std::operator+(&local_210,"enum value alias <",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &((valueIt._M_current)->bitpos)._M_string_length);
        std::operator+(&local_1f0,&local_210,"> aliases enum value <");
        std::operator+(&local_1d0,&local_1f0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       valueIt._M_current);
        std::operator+(&local_1b0,&local_1d0,"> with different properties");
        checkForError(condition,iVar1,&local_1b0);
        std::__cxx11::string::~string((string *)&local_1b0);
        std::__cxx11::string::~string((string *)&local_1d0);
        std::__cxx11::string::~string((string *)&local_1f0);
        std::__cxx11::string::~string((string *)&local_210);
        pEVar4 = __gnu_cxx::
                 __normal_iterator<VulkanHppGenerator::EnumValueData_*,_std::vector<VulkanHppGenerator::EnumValueData,_std::allocator<VulkanHppGenerator::EnumValueData>_>_>
                 ::operator->(&local_58);
        local_218 = valueIt._M_current;
        bVar2 = std::ranges::__none_of_fn::
                operator()<std::vector<VulkanHppGenerator::EnumValueAlias,_std::allocator<VulkanHppGenerator::EnumValueAlias>_>_&,_std::identity,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_KhronosGroup[P]Vulkan_Hpp_VulkanHppGenerator_cpp:1981:62)>
                          ((__none_of_fn *)&std::ranges::none_of,pEVar4,valueIt._M_current);
        iVar1 = *(int *)((long)&((valueIt._M_current)->protect)._M_dataplus._M_p + 4);
        std::operator+(&local_2a0,"enum value alias <",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &((valueIt._M_current)->bitpos)._M_string_length);
        std::operator+(&local_280,&local_2a0,"> already contained as alias for enum value <");
        std::operator+(&local_260,&local_280,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       valueIt._M_current);
        std::operator+(&local_240,&local_260,">");
        checkForError(bVar2,iVar1,&local_240);
        std::__cxx11::string::~string((string *)&local_240);
        std::__cxx11::string::~string((string *)&local_260);
        std::__cxx11::string::~string((string *)&local_280);
        std::__cxx11::string::~string((string *)&local_2a0);
        pEVar4 = __gnu_cxx::
                 __normal_iterator<VulkanHppGenerator::EnumValueData_*,_std::vector<VulkanHppGenerator::EnumValueData,_std::allocator<VulkanHppGenerator::EnumValueData>_>_>
                 ::operator->(&local_58);
        std::
        vector<VulkanHppGenerator::EnumValueAlias,_std::allocator<VulkanHppGenerator::EnumValueAlias>_>
        ::push_back(&pEVar4->aliases,(value_type *)valueIt._M_current);
        __gnu_cxx::
        __normal_iterator<VulkanHppGenerator::EnumValueAlias_*,_std::vector<VulkanHppGenerator::EnumValueAlias,_std::allocator<VulkanHppGenerator::EnumValueAlias>_>_>
        ::operator++(&__end2);
      }
      std::
      vector<VulkanHppGenerator::EnumValueAlias,_std::allocator<VulkanHppGenerator::EnumValueAlias>_>
      ::clear(&(ppVar3->second).valueAliases);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>_>
      ::operator++(&__end1);
    }
    return;
  }
  __assert_fail("m_enumExtends.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                ,0x7ac,"void VulkanHppGenerator::distributeEnumValueAliases()");
}

Assistant:

void VulkanHppGenerator::distributeEnumValueAliases()
{
  assert( m_enumExtends.empty() );

  for ( auto & e : m_enums )
  {
    for ( auto & a : e.second.valueAliases )
    {
      auto valueIt = findByName( e.second.values, a.alias );
      if ( valueIt == e.second.values.end() )
      {
        auto aliasIt = findByName( e.second.valueAliases, a.alias );
        checkForError(
          aliasIt != e.second.valueAliases.end(), a.xmlLine, "enum value alias <" + a.name + "> aliases non-existent enum value <" + a.alias + ">" );
        valueIt = findByName( e.second.values, aliasIt->alias );
      }
      checkForError( valueIt != e.second.values.end(), a.xmlLine, "enum value alias <" + a.name + "> aliases non-existent enum value <" + a.alias + ">" );
      checkForError(
        a.protect == valueIt->protect, a.xmlLine, "enum value alias <" + a.name + "> aliases enum value <" + a.alias + "> with different properties" );
      checkForError( std::ranges::none_of( valueIt->aliases, [&a]( auto const & eav ) { return a.name == eav.name; } ),
                     a.xmlLine,
                     "enum value alias <" + a.name + "> already contained as alias for enum value <" + a.alias + ">" );
      valueIt->aliases.push_back( a );
    }
    e.second.valueAliases.clear();
  }
}